

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O2

void __thiscall
btGeneric6DofSpring2Constraint::calculateTransforms
          (btGeneric6DofSpring2Constraint *this,btTransform *transA,btTransform *transB)

{
  float fVar1;
  uint uVar2;
  float fVar3;
  btTransform local_58;
  
  btTransform::operator*(&local_58,transA,&this->m_frameInA);
  *(undefined8 *)(this->m_calculatedTransformA).m_basis.m_el[0].m_floats =
       local_58.m_basis.m_el[0].m_floats._0_8_;
  *(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[0].m_floats + 2) =
       local_58.m_basis.m_el[0].m_floats._8_8_;
  *(undefined8 *)(this->m_calculatedTransformA).m_basis.m_el[1].m_floats =
       local_58.m_basis.m_el[1].m_floats._0_8_;
  *(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[1].m_floats + 2) =
       local_58.m_basis.m_el[1].m_floats._8_8_;
  *(undefined8 *)(this->m_calculatedTransformA).m_basis.m_el[2].m_floats =
       local_58.m_basis.m_el[2].m_floats._0_8_;
  *(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[2].m_floats + 2) =
       local_58.m_basis.m_el[2].m_floats._8_8_;
  *(undefined8 *)(this->m_calculatedTransformA).m_origin.m_floats = local_58.m_origin.m_floats._0_8_
  ;
  *(undefined8 *)((this->m_calculatedTransformA).m_origin.m_floats + 2) =
       local_58.m_origin.m_floats._8_8_;
  btTransform::operator*(&local_58,transB,&this->m_frameInB);
  *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[0].m_floats =
       local_58.m_basis.m_el[0].m_floats._0_8_;
  *(undefined8 *)((this->m_calculatedTransformB).m_basis.m_el[0].m_floats + 2) =
       local_58.m_basis.m_el[0].m_floats._8_8_;
  *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[1].m_floats =
       local_58.m_basis.m_el[1].m_floats._0_8_;
  *(undefined8 *)((this->m_calculatedTransformB).m_basis.m_el[1].m_floats + 2) =
       local_58.m_basis.m_el[1].m_floats._8_8_;
  *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[2].m_floats =
       local_58.m_basis.m_el[2].m_floats._0_8_;
  *(undefined8 *)((this->m_calculatedTransformB).m_basis.m_el[2].m_floats + 2) =
       local_58.m_basis.m_el[2].m_floats._8_8_;
  *(undefined8 *)(this->m_calculatedTransformB).m_origin.m_floats = local_58.m_origin.m_floats._0_8_
  ;
  *(undefined8 *)((this->m_calculatedTransformB).m_origin.m_floats + 2) =
       local_58.m_origin.m_floats._8_8_;
  calculateLinearInfo(this);
  calculateAngleInfo(this);
  fVar3 = ((this->super_btTypedConstraint).m_rbA)->m_inverseMass;
  fVar1 = ((this->super_btTypedConstraint).m_rbB)->m_inverseMass;
  this->m_hasStaticBody = (bool)((-(fVar3 < 1.1920929e-07) | -(fVar1 < 1.1920929e-07)) & 1);
  fVar3 = fVar3 + fVar1;
  uVar2 = -(uint)(0.0 < fVar3);
  fVar3 = (float)(~uVar2 & 0x3f000000 | (uint)(fVar1 / fVar3) & uVar2);
  this->m_factA = fVar3;
  this->m_factB = 1.0 - fVar3;
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::calculateTransforms(const btTransform& transA,const btTransform& transB)
{
	m_calculatedTransformA = transA * m_frameInA;
	m_calculatedTransformB = transB * m_frameInB;
	calculateLinearInfo();
	calculateAngleInfo();

	btScalar miA = getRigidBodyA().getInvMass();
	btScalar miB = getRigidBodyB().getInvMass();
	m_hasStaticBody = (miA < SIMD_EPSILON) || (miB < SIMD_EPSILON);
	btScalar miS = miA + miB;
	if(miS > btScalar(0.f))
	{
		m_factA = miB / miS;
	}
	else 
	{
		m_factA = btScalar(0.5f);
	}
	m_factB = btScalar(1.0f) - m_factA;
}